

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

int iSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **iMatch,int *iGroup,int *iLastItem,
               int *oGroup)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int iVar6;
  int local_64;
  
  local_64 = 0;
  for (lVar5 = 0; lVar5 < *iLastItem; lVar5 = lVar5 + 1) {
    if (iMatch[lVar5]->nSize != 1) {
      p = Vec_IntAlloc(iMatch[lVar5]->nSize);
      p_00 = Vec_IntAlloc(iMatch[lVar5]->nSize);
      iVar6 = 0;
      while( true ) {
        pVVar4 = iMatch[lVar5];
        if (pVVar4->nSize <= iVar6) break;
        iVar2 = 0;
        iVar3 = 0;
        while( true ) {
          iVar1 = Vec_IntEntry(pVVar4,iVar6);
          if (iDep[iVar1]->nSize <= iVar2) break;
          iVar1 = Vec_IntEntry(iMatch[lVar5],iVar6);
          iVar1 = Vec_IntEntry(iDep[iVar1],iVar2);
          iVar3 = iVar3 + oGroup[iVar1];
          iVar2 = iVar2 + 1;
          pVVar4 = iMatch[lVar5];
        }
        Vec_IntPush(p,iVar3);
        Vec_IntPushUniqueOrder(p_00,iVar3);
        iVar6 = iVar6 + 1;
      }
      while (1 < p_00->nSize) {
        for (iVar6 = 0; iVar6 < iMatch[lVar5]->nSize; iVar6 = iVar6 + 1) {
          iVar2 = Vec_IntEntry(p,iVar6);
          iVar3 = Vec_IntEntryLast(p_00);
          if (iVar2 == iVar3) {
            pVVar4 = iMatch[(long)local_64 + (long)*iLastItem];
            iVar2 = Vec_IntEntry(iMatch[lVar5],iVar6);
            Vec_IntPush(pVVar4,iVar2);
            iVar2 = *iLastItem;
            iVar3 = Vec_IntEntry(iMatch[lVar5],iVar6);
            iGroup[iVar3] = iVar2 + local_64;
            pVVar4 = iMatch[lVar5];
            iVar2 = Vec_IntEntry(pVVar4,iVar6);
            Vec_IntRemove(pVVar4,iVar2);
            iVar2 = Vec_IntEntry(p,iVar6);
            Vec_IntRemove(p,iVar2);
            iVar6 = iVar6 + -1;
          }
        }
        local_64 = local_64 + 1;
        Vec_IntPop(p_00);
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
    }
  }
  *iLastItem = *iLastItem + local_64;
  return local_64;
}

Assistant:

int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup)
{
    int i, j, k;    
    int numOfItemsAdded = 0;
    Vec_Int_t * array, * sortedArray;    

    for(i = 0; i < *iLastItem; i++)
    {
        if(Vec_IntSize(iMatch[i]) == 1)
            continue;
        
        array = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );

        for(j = 0; j < Vec_IntSize(iMatch[i]); j++)
        {        
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(iDep[Vec_IntEntry(iMatch[i], j)]); k++)                            
                encode += oGroup[Vec_IntEntry(iDep[Vec_IntEntry(iMatch[i], j)], k)] * factor;                        

            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);
            
            //printf("%d ", Vec_IntEntry(array, j));
        }            
                
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(iMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(iMatch[*iLastItem+numOfItemsAdded], Vec_IntEntry(iMatch[i], k));
                    iGroup[Vec_IntEntry(iMatch[i], k)] = *iLastItem+numOfItemsAdded;
                    Vec_IntRemove( iMatch[i], Vec_IntEntry(iMatch[i], k) );                            
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );    
                    k--;
                }
            }
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);    
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );    
        //printf("\n");
    }    

    *iLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *iLastItem ; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;    
}